

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O1

TestAllTypes *
google::protobuf::DynamicCastMessage<edition_unittest::TestAllTypes>(MessageLite *from)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  LogMessage *this;
  TestAllTypes *pTVar3;
  TestAllTypes *this_00;
  string_view str;
  string_view sVar4;
  LogMessage LStack_50;
  TestAllTypes *pTStack_40;
  code *pcStack_38;
  MessageLite *pMStack_28;
  code *pcStack_20;
  
  pcStack_20 = (code *)0x6873eb;
  lVar2 = (**(code **)(edition_unittest::_TestAllTypes_default_instance_ + 0x20))();
  pcStack_20 = (code *)0x6873f7;
  pTVar3 = (TestAllTypes *)from;
  iVar1 = (*from->_vptr_MessageLite[4])();
  if (lVar2 == CONCAT44(extraout_var,iVar1)) {
    return (TestAllTypes *)from;
  }
  pcStack_20 = DynamicCastMessage<edition_unittest::TestRequired>;
  DynamicCastMessage<edition_unittest::TestAllTypes>();
  pcStack_38 = (code *)0x687420;
  pMStack_28 = from;
  pcStack_20 = (code *)lVar2;
  lVar2 = (**(code **)(edition_unittest::_TestRequired_default_instance_ + 0x20))();
  pcStack_38 = (code *)0x68742c;
  this_00 = pTVar3;
  iVar1 = (*(pTVar3->super_Message).super_MessageLite._vptr_MessageLite[4])();
  if (lVar2 != CONCAT44(extraout_var_00,iVar1)) {
    pcStack_38 = DownCastMessage<edition_unittest::TestAllTypes_const>;
    DynamicCastMessage<edition_unittest::TestRequired>();
    pTStack_40 = pTVar3;
    pcStack_38 = (code *)lVar2;
    if (this_00 == (TestAllTypes *)0x0) {
      pTVar3 = (TestAllTypes *)0x0;
    }
    else {
      lVar2 = (**(code **)(edition_unittest::_TestAllTypes_default_instance_ + 0x20))();
      iVar1 = (*(this_00->super_Message).super_MessageLite._vptr_MessageLite[4])(this_00);
      pTVar3 = (TestAllTypes *)0x0;
      if (lVar2 == CONCAT44(extraout_var_01,iVar1)) {
        pTVar3 = this_00;
      }
    }
    if (pTVar3 != this_00) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.h"
                 ,0x595,"DynamicCastMessage<T>(from) == from");
      sVar4._M_str = "Cannot downcast ";
      sVar4._M_len = 0x10;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&LStack_50,sVar4);
      sVar4 = MessageLite::GetTypeName((MessageLite *)this_00);
      this = absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_50,sVar4);
      str._M_str = " to ";
      str._M_len = 4;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this,str);
      sVar4 = MessageLite::GetTypeName
                        ((MessageLite *)&edition_unittest::_TestAllTypes_default_instance_);
      absl::lts_20250127::log_internal::LogMessage::operator<<(this,sVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&LStack_50);
    }
    return this_00;
  }
  return pTVar3;
}

Assistant:

const T& DynamicCastMessage(const MessageLite& from) {
  const T* destination_message = DynamicCastMessage<T>(&from);
  if (ABSL_PREDICT_FALSE(destination_message == nullptr)) {
    // If exceptions are enabled, throw.
    // Otherwise, log a fatal error.
#if defined(ABSL_HAVE_EXCEPTIONS)
    throw std::bad_cast();
#endif
    // Move the logging into an out-of-line function to reduce bloat in the
    // caller.
    internal::FailDynamicCast(from, T::default_instance());
  }
  return *destination_message;
}